

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t iconv_strncat_in_locale(archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  wchar_t wVar1;
  uchar *p;
  archive_string *paVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  wchar_t wVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *outp;
  size_t remaining;
  char *itp;
  char *local_70;
  ulong local_68;
  size_t local_60;
  wchar_t local_54;
  char *local_50;
  archive_string_conv *local_48;
  char *local_40;
  iconv_t local_38;
  
  wVar1 = sc->flag;
  uVar9 = (ulong)((wVar1 & 0x1400U) != 0);
  uVar8 = 2 - (ulong)((wVar1 & 0x2800U) == 0);
  local_50 = (char *)_p;
  paVar2 = archive_string_ensure(as,uVar9 + length * 2 + as->length + 1);
  if (paVar2 == (archive_string *)0x0) {
LAB_0010dfa8:
    wVar6 = L'\xffffffff';
  }
  else {
    uVar9 = ~uVar9;
    local_38 = sc->cd;
    local_40 = local_50;
    pcVar5 = as->s;
    local_70 = pcVar5 + as->length;
    local_68 = (uVar9 - as->length) + as->buffer_length;
    wVar6 = L'\0';
    local_54 = wVar1;
    if (uVar8 <= length) {
      local_50 = (char *)(ulong)((wVar1 & 0x1400U) != 0);
      wVar6 = L'\0';
      local_60 = length;
      local_48 = sc;
      do {
        sVar3 = iconv(local_38,&local_40,&local_60,&local_70,&local_68);
        if (sVar3 != 0xffffffffffffffff) break;
        piVar4 = __errno_location();
        if ((*piVar4 == 0x54) || (*piVar4 == 0x16)) {
          wVar1 = local_48->flag;
          if ((wVar1 & 0x1500U) == 0) {
            *local_70 = '?';
            local_68 = local_68 - 1;
            local_70 = local_70 + 1;
          }
          else {
            uVar7 = (ulong)(((uint)wVar1 >> 8 & 1) != 0) + 2;
            if (local_68 < uVar7) {
              as->length = (long)local_70 - (long)as->s;
              paVar2 = archive_string_ensure
                                 (as,as->buffer_length + uVar7 +
                                     (local_60 << ((byte)local_50 & 0x3f)));
              if (paVar2 == (archive_string *)0x0) goto LAB_0010dfa8;
              local_70 = as->s + as->length;
              local_68 = (uVar9 - as->length) + as->buffer_length;
              wVar1 = local_48->flag;
            }
            if (((uint)wVar1 >> 8 & 1) == 0) {
              if (((uint)wVar1 >> 10 & 1) == 0) {
                local_70[0] = -3;
                local_70[1] = -1;
              }
              else {
                local_70[0] = -1;
                local_70[1] = -3;
              }
            }
            else {
              local_70[2] = -0x43;
              local_70[0] = -0x11;
              local_70[1] = -0x41;
            }
            local_68 = local_68 - uVar7;
            local_70 = local_70 + uVar7;
          }
          local_40 = local_40 + uVar8;
          local_60 = local_60 - uVar8;
          wVar6 = L'\xffffffff';
        }
        else {
          as->length = (long)local_70 - (long)as->s;
          paVar2 = archive_string_ensure(as,local_60 * 2 + as->buffer_length);
          if (paVar2 == (archive_string *)0x0) goto LAB_0010dfa8;
          local_70 = as->s + as->length;
          local_68 = (uVar9 - as->length) + as->buffer_length;
        }
      } while (uVar8 <= local_60);
      pcVar5 = as->s;
    }
    as->length = (long)local_70 - (long)pcVar5;
    *local_70 = '\0';
    if ((local_54 & 0x1400U) != 0) {
      as->s[as->length + 1] = '\0';
    }
  }
  return wVar6;
}

Assistant:

static int
iconv_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	ICONV_CONST char *itp;
	size_t remaining;
	iconv_t cd;
	char *outp;
	size_t avail, bs;
	int return_value = 0; /* success */
	int to_size, from_size;

	if (sc->flag & SCONV_TO_UTF16)
		to_size = 2;
	else
		to_size = 1;
	if (sc->flag & SCONV_FROM_UTF16)
		from_size = 2;
	else
		from_size = 1;

	if (archive_string_ensure(as, as->length + length*2+to_size) == NULL)
		return (-1);

	cd = sc->cd;
	itp = (char *)(uintptr_t)_p;
	remaining = length;
	outp = as->s + as->length;
	avail = as->buffer_length - as->length - to_size;
	while (remaining >= (size_t)from_size) {
		size_t result = iconv(cd, &itp, &remaining, &outp, &avail);

		if (result != (size_t)-1)
			break; /* Conversion completed. */

		if (errno == EILSEQ || errno == EINVAL) {
			/*
		 	 * If an output charset is UTF-8 or UTF-16BE/LE,
			 * unknown character should be U+FFFD
			 * (replacement character).
			 */
			if (sc->flag & (SCONV_TO_UTF8 | SCONV_TO_UTF16)) {
				size_t rbytes;
				if (sc->flag & SCONV_TO_UTF8)
					rbytes = sizeof(utf8_replacement_char);
				else
					rbytes = 2;

				if (avail < rbytes) {
					as->length = outp - as->s;
					bs = as->buffer_length +
					    (remaining * to_size) + rbytes;
					if (NULL ==
					    archive_string_ensure(as, bs))
						return (-1);
					outp = as->s + as->length;
					avail = as->buffer_length
					    - as->length - to_size;
				}
				if (sc->flag & SCONV_TO_UTF8)
					memcpy(outp, utf8_replacement_char, sizeof(utf8_replacement_char));
				else if (sc->flag & SCONV_TO_UTF16BE)
					archive_be16enc(outp, UNICODE_R_CHAR);
				else
					archive_le16enc(outp, UNICODE_R_CHAR);
				outp += rbytes;
				avail -= rbytes;
			} else {
				/* Skip the illegal input bytes. */
				*outp++ = '?';
				avail--;
			}
			itp += from_size;
			remaining -= from_size;
			return_value = -1; /* failure */
		} else {
			/* E2BIG no output buffer,
			 * Increase an output buffer.  */
			as->length = outp - as->s;
			bs = as->buffer_length + remaining * 2;
			if (NULL == archive_string_ensure(as, bs))
				return (-1);
			outp = as->s + as->length;
			avail = as->buffer_length - as->length - to_size;
		}
	}
	as->length = outp - as->s;
	as->s[as->length] = 0;
	if (to_size == 2)
		as->s[as->length+1] = 0;
	return (return_value);
}